

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Float __thiscall pbrt::Image::BilerpChannel(Image *this,Point2f p,int c,WrapMode2D wrapMode)

{
  undefined8 unaff_RBX;
  long lVar1;
  Point2i p_00;
  Point2i p_01;
  undefined1 auVar2 [16];
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  initializer_list<float> v_00;
  initializer_list<float> v_01;
  span<const_float> v_02;
  undefined8 local_68;
  Float local_60;
  Float local_5c;
  undefined1 local_58 [16];
  array<float,_2> local_48;
  array<float,_4> v;
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar2._8_4_ = 0xbf000000;
  auVar2._0_8_ = 0xbf000000bf000000;
  auVar2._12_4_ = 0xbf000000;
  auVar2 = vfmadd213ps_avx512vl(auVar6,auVar5._0_16_,auVar2);
  auVar6 = vroundps_avx(auVar2,9);
  auVar4._0_4_ = (int)auVar6._0_4_;
  auVar4._4_4_ = (uint)auVar6._4_4_;
  auVar4._8_4_ = (int)auVar6._8_4_;
  auVar4._12_4_ = (int)auVar6._12_4_;
  auVar6 = vcvtdq2ps_avx(auVar4);
  lVar1 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),auVar4._0_4_);
  local_58 = vsubps_avx(auVar2,auVar6);
  FVar3 = GetChannel(this,(Point2i)(((ulong)auVar4._4_4_ << 0x20) + lVar1),c,wrapMode);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = auVar4._4_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = auVar4._0_4_ + 1;
  local_68 = CONCAT44(local_68._4_4_,FVar3);
  FVar3 = GetChannel(this,p_00,c,wrapMode);
  local_68 = CONCAT44(FVar3,(float)local_68);
  local_60 = GetChannel(this,(Point2i)(((ulong)(auVar4._4_4_ + 1) << 0x20) + lVar1),c,wrapMode);
  p_01.super_Tuple2<pbrt::Point2,_int>.y = auVar4._4_4_ + 1;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = auVar4._0_4_ + 1;
  local_5c = GetChannel(this,p_01,c,wrapMode);
  v_00._M_len = 4;
  v_00._M_array = (iterator)&local_68;
  pstd::array<float,_4>::array(&v,v_00);
  local_68 = vmovlps_avx(local_58);
  v_01._M_len = 2;
  v_01._M_array = (iterator)&local_68;
  pstd::array<float,_2>::array(&local_48,v_01);
  v_02.n = 4;
  v_02.ptr = v.values;
  FVar3 = pbrt::Bilerp(local_48,v_02);
  return FVar3;
}

Assistant:

PBRT_CPU_GPU
    Float BilerpChannel(Point2f p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        Float x = p[0] * resolution.x - 0.5f, y = p[1] * resolution.y - 0.5f;
        int xi = std::floor(x), yi = std::floor(y);
        Float dx = x - xi, dy = y - yi;
        pstd::array<Float, 4> v = {GetChannel({xi, yi}, c, wrapMode),
                                   GetChannel({xi + 1, yi}, c, wrapMode),
                                   GetChannel({xi, yi + 1}, c, wrapMode),
                                   GetChannel({xi + 1, yi + 1}, c, wrapMode)};
        return pbrt::Bilerp({dx, dy}, v);
    }